

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_sub_complex.h
# Opt level: O0

bool Gudhi::skeleton_blocker::
     proper_faces_in_union<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>>
               (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>
                *sigma,Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
                       *link1,
               Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
               *link2)

{
  bool bVar1;
  size_type sVar2;
  ulong local_70;
  size_t current_index;
  undefined1 local_58 [8];
  vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
  addresses_sigma_in_link2;
  vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
  addresses_sigma_in_link1;
  Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  *link2_local;
  Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  *link1_local;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>
  *sigma_local;
  
  Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  ::get_addresses((vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                   *)&addresses_sigma_in_link2.
                      super__Vector_base<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,link1,sigma);
  Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  ::get_addresses((vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                   *)local_58,link2,sigma);
  local_70 = 0;
  do {
    sVar2 = std::
            vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
            ::size((vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                    *)&addresses_sigma_in_link2.
                       super__Vector_base<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= local_70) {
      sigma_local._7_1_ = true;
LAB_00125e82:
      std::
      vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
      ::~vector((vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                 *)local_58);
      std::
      vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
      ::~vector((vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                 *)&addresses_sigma_in_link2.
                    super__Vector_base<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return sigma_local._7_1_;
    }
    bVar1 = proper_face_in_union<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>>
                      (link1,(vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                              *)&addresses_sigma_in_link2.
                                 super__Vector_base<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_70);
    if (!bVar1) {
      bVar1 = proper_face_in_union<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>>
                        (link2,(vector<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                                *)local_58,local_70);
      if (!bVar1) {
        sigma_local._7_1_ = false;
        goto LAB_00125e82;
      }
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

bool proper_faces_in_union(
                           Skeleton_blocker_simplex<typename ComplexType::Root_vertex_handle> & sigma,
                           Skeleton_blocker_sub_complex<ComplexType> & link1,
                           Skeleton_blocker_sub_complex<ComplexType> & link2) {
  typedef typename ComplexType::Vertex_handle Vertex_handle;
  std::vector < boost::optional<Vertex_handle> > addresses_sigma_in_link1 =
      link1.get_addresses(sigma);
  std::vector < boost::optional<Vertex_handle> > addresses_sigma_in_link2 =
      link2.get_addresses(sigma);

  for (std::size_t current_index = 0; current_index < addresses_sigma_in_link1.size();
       ++current_index) {
    if (!proper_face_in_union(link1, addresses_sigma_in_link1, current_index)
        && !proper_face_in_union(link2, addresses_sigma_in_link2,
                                 current_index)) {
      return false;
    }
  }
  return true;
}